

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O0

int Curl_llist_insert_next(curl_llist *list,curl_llist_element *e,void *p)

{
  curl_llist_element *pcVar1;
  curl_llist_element *local_38;
  curl_llist_element *ne;
  void *p_local;
  curl_llist_element *e_local;
  curl_llist *list_local;
  
  pcVar1 = (curl_llist_element *)(*Curl_cmalloc)(0x18);
  if (pcVar1 == (curl_llist_element *)0x0) {
    list_local._4_4_ = 0;
  }
  else {
    pcVar1->ptr = p;
    if (list->size == 0) {
      list->head = pcVar1;
      list->head->prev = (curl_llist_element *)0x0;
      list->head->next = (curl_llist_element *)0x0;
      list->tail = pcVar1;
    }
    else {
      if (e == (curl_llist_element *)0x0) {
        local_38 = list->head;
      }
      else {
        local_38 = e->next;
      }
      pcVar1->next = local_38;
      pcVar1->prev = e;
      if (e == (curl_llist_element *)0x0) {
        list->head->prev = pcVar1;
        list->head = pcVar1;
      }
      else if (e->next == (curl_llist_element *)0x0) {
        list->tail = pcVar1;
      }
      else {
        e->next->prev = pcVar1;
      }
      if (e != (curl_llist_element *)0x0) {
        e->next = pcVar1;
      }
    }
    list->size = list->size + 1;
    list_local._4_4_ = 1;
  }
  return list_local._4_4_;
}

Assistant:

int
Curl_llist_insert_next(struct curl_llist *list, struct curl_llist_element *e,
                       const void *p)
{
  struct curl_llist_element *ne = malloc(sizeof(struct curl_llist_element));
  if(!ne)
    return 0;

  ne->ptr = (void *) p;
  if(list->size == 0) {
    list->head = ne;
    list->head->prev = NULL;
    list->head->next = NULL;
    list->tail = ne;
  }
  else {
    /* if 'e' is NULL here, we insert the new element first in the list */
    ne->next = e?e->next:list->head;
    ne->prev = e;
    if(!e) {
      list->head->prev = ne;
      list->head = ne;
    }
    else if(e->next) {
      e->next->prev = ne;
    }
    else {
      list->tail = ne;
    }
    if(e)
      e->next = ne;
  }

  ++list->size;

  return 1;
}